

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O0

boolean figurine_location_checks(obj *obj,coord *cc,boolean quietly)

{
  char x_00;
  char y_00;
  boolean bVar1;
  obj *poVar2;
  char *pcVar3;
  bool bVar4;
  xchar y;
  xchar x;
  boolean quietly_local;
  coord *cc_local;
  obj *obj_local;
  
  if ((obj->where == '\x03') && ((u._1052_1_ & 1) != 0)) {
    if (quietly == '\0') {
      pline("You don\'t have enough room in here.");
    }
    return '\0';
  }
  x_00 = cc->x;
  y_00 = cc->y;
  if ((((x_00 < '\x01') || ('O' < x_00)) || (y_00 < '\0')) || ('\x14' < y_00)) {
    if (quietly == '\0') {
      pline("You cannot put the figurine there.");
    }
    return '\0';
  }
  if ((level->locations[x_00][y_00].typ < '\x11') &&
     (((mons[obj->corpsenm].mflags1 & 8) == 0 ||
      (bVar1 = may_passwall(level,x_00,y_00), bVar1 == '\0')))) {
    if (quietly == '\0') {
      bVar4 = true;
      if ((level->locations[x_00][y_00].typ != '\r') &&
         (((*(uint *)&(level->flags).field_0x8 >> 0x14 & 1) == 0 ||
          (bVar4 = true, level->locations[x_00][y_00].typ != '\0')))) {
        bVar4 = level->locations[x_00][y_00].typ == '\x0e';
      }
      pcVar3 = "solid rock";
      if (bVar4) {
        pcVar3 = "a tree";
      }
      pline("You cannot place a figurine in %s!",pcVar3);
    }
    return '\0';
  }
  poVar2 = sobj_at(0x214,level,(int)x_00,(int)y_00);
  if ((poVar2 != (obj *)0x0) &&
     (((mons[obj->corpsenm].mflags1 & 8) == 0 && ((mons[obj->corpsenm].mflags2 & 0x8000000) == 0))))
  {
    if (quietly == '\0') {
      pline("You cannot fit the figurine on the boulder.");
    }
    return '\0';
  }
  return '\x01';
}

Assistant:

static boolean figurine_location_checks(struct obj *obj, coord *cc, boolean quietly)
{
	xchar x,y;

	if (carried(obj) && u.uswallow) {
		if (!quietly)
			pline("You don't have enough room in here.");
		return FALSE;
	}
	x = cc->x; y = cc->y;
	if (!isok(x,y)) {
		if (!quietly)
			pline("You cannot put the figurine there.");
		return FALSE;
	}
	if (IS_ROCK(level->locations[x][y].typ) &&
	    !(passes_walls(&mons[obj->corpsenm]) && may_passwall(level, x,y))) {
		if (!quietly)
		    pline("You cannot place a figurine in %s!",
			  IS_TREES(level, level->locations[x][y].typ) ?
			  "a tree" : "solid rock");
		return FALSE;
	}
	if (sobj_at(BOULDER, level, x,y) && !passes_walls(&mons[obj->corpsenm])
			&& !throws_rocks(&mons[obj->corpsenm])) {
		if (!quietly)
			pline("You cannot fit the figurine on the boulder.");
		return FALSE;
	}
	return TRUE;
}